

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O2

void __thiscall disp::hg(disp *this,cmatch *m)

{
  string_type local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string_type local_90;
  value_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  value_type local_38;
  
  booster::match_results<const_char_*>::operator[](&local_38,m,0);
  booster::sub_match<char_const*>::str_abi_cxx11_(&local_90,&local_38);
  std::operator+(&local_d0,"m:",&local_90);
  std::operator+(&local_b0,&local_d0,':');
  booster::match_results<const_char_*>::operator[](&local_70,m,1);
  booster::sub_match<char_const*>::str_abi_cxx11_(&local_f0,&local_70);
  std::operator+(&local_58,&local_b0,&local_f0);
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void hg(booster::cmatch const &m)
	{ v_ = "m:" + std::string(m[0]) +':'+std::string(m[1]); }